

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O1

libcaption_stauts_t cea708_parse_h264(uint8_t *data,size_t size,cea708_t *cea708)

{
  byte bVar1;
  uint uVar2;
  ushort uVar3;
  ulong size_00;
  uint8_t *data_00;
  
  if (size < 3) {
    return LIBCAPTION_ERROR;
  }
  bVar1 = *data;
  cea708->country = (uint)bVar1;
  uVar3 = *(ushort *)(data + 1) << 8 | *(ushort *)(data + 1) >> 8;
  cea708->provider = (uint)uVar3;
  cea708->user_identifier = 0;
  cea708->user_data_type_code = '\0';
  size_00 = size - 3;
  if (uVar3 == 0x31) {
    if (size_00 < 4) {
      return LIBCAPTION_ERROR;
    }
    uVar2 = *(uint *)(data + 3);
    cea708->user_identifier =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    data_00 = data + 7;
    size_00 = size - 7;
  }
  else {
    data_00 = data + 3;
  }
  if (bVar1 == 0 && uVar3 == 0) {
    if (size_00 == 0) {
      return LIBCAPTION_ERROR;
    }
  }
  else {
    if ((uVar3 != 0x31) && (uVar3 != 0x2f)) goto LAB_001091a7;
    if (size_00 == 0) {
      return LIBCAPTION_ERROR;
    }
    cea708->user_data_type_code = *data_00;
  }
  data_00 = data_00 + 1;
  size_00 = size_00 - 1;
LAB_001091a7:
  if (uVar3 == 0x2f) {
    if (size_00 == 0) {
      return LIBCAPTION_ERROR;
    }
    cea708->directv_user_data_length = *data_00;
    data_00 = data_00 + 1;
    size_00 = size_00 - 1;
  }
  if ((1 < size_00) && (cea708->user_data_type_code == '\x03')) {
    cea708_parse_user_data_type_strcture(data_00,size_00,&cea708->user_data);
  }
  return LIBCAPTION_OK;
}

Assistant:

libcaption_stauts_t cea708_parse_h264(const uint8_t* data, size_t size, cea708_t* cea708)
{
    if (3 > size) {
        goto error;
    }

    // I think the first few bytes need to be handled in mpeg
    cea708->country = (itu_t_t35_country_code_t)(data[0]);
    cea708->provider = (itu_t_t35_provider_code_t)((data[1] << 8) | data[2]);
    cea708->user_identifier = 0;
    cea708->user_data_type_code = 0;
    data += 3, size -= 3;

    if (t35_provider_atsc == cea708->provider) {
        if (4 > size) {
            goto error;
        }

        cea708->user_identifier = ((data[0] << 24) | (data[1] << 16) | (data[2] << 8) | data[3]);
        data += 4, size -= 4;
    }

    // where country and provider are zero
    // Im not sure what this extra byte is. It sonly seesm to come up in onCaptionInfo
    // h264 spec seems to describe this
    if (0 == cea708->provider && 0 == cea708->country) {
        if (1 > size) {
            goto error;
        }

        data += 1, size -= 1;
    } else if (t35_provider_atsc == cea708->provider || t35_provider_direct_tv == cea708->provider) {
        if (1 > size) {
            goto error;
        }

        cea708->user_data_type_code = data[0];
        data += 1, size -= 1;
    }

    if (t35_provider_direct_tv == cea708->provider) {
        if (1 > size) {
            goto error;
        }

        cea708->directv_user_data_length = data[0];
        data += 1, size -= 1;
    }

    if (3 == cea708->user_data_type_code && 2 <= size) {
        cea708_parse_user_data_type_strcture(data, size, &cea708->user_data);
    } else if (4 == cea708->user_data_type_code) {
        // additional_CEA_608_data
    } else if (5 == cea708->user_data_type_code) {
        // luma_PAM_data
    } else {
        // ATSC_reserved_user_data
    }

    return LIBCAPTION_OK;
error:
    return LIBCAPTION_ERROR;
}